

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O2

int __thiscall zmq::session_base_t::zap_connect(session_base_t *this)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *errmsg_;
  char *pcVar4;
  void *__buf;
  bool conflates [2];
  pipe_t *new_pipes [2];
  int hwms [2];
  object_t *parents [2];
  msg_t id;
  endpoint_t peer;
  
  iVar1 = 0;
  if (this->_zap_pipe == (pipe_t *)0x0) {
    object_t::find_endpoint(&peer,(object_t *)this,"inproc://zeromq.zap.01");
    if (peer.socket == (socket_base_t *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0x6f;
      iVar1 = -1;
    }
    else {
      if ((0xc < (byte)peer.options.type) ||
         ((0x1050U >> ((byte)peer.options.type & 0x1f) & 1) == 0)) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                "peer.options.type == ZMQ_REP || peer.options.type == ZMQ_ROUTER || peer.options.type == ZMQ_SERVER"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x173);
        fflush(_stderr);
        zmq_abort(
                 "peer.options.type == ZMQ_REP || peer.options.type == ZMQ_ROUTER || peer.options.type == ZMQ_SERVER"
                 );
      }
      parents[1] = (object_t *)peer.socket;
      new_pipes[0] = (pipe_t *)0x0;
      new_pipes[1] = (pipe_t *)0x0;
      hwms[0] = 0;
      hwms[1] = 0;
      conflates[0] = false;
      conflates[1] = false;
      parents[0] = (object_t *)this;
      iVar1 = pipepair(parents,new_pipes,hwms,conflates);
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                ,0x17c);
        fflush(_stderr);
        zmq_abort(pcVar4);
      }
      this->_zap_pipe = new_pipes[0];
      pipe_t::set_nodelay(new_pipes[0]);
      pipe_t::set_event_sink(this->_zap_pipe,&this->super_i_pipe_events);
      pcVar4 = (char *)0x0;
      object_t::send_bind((object_t *)this,&(peer.socket)->super_own_t,new_pipes[1],false);
      if (peer.options.recv_routing_id == true) {
        iVar1 = msg_t::init(&id,(EVP_PKEY_CTX *)peer.socket);
        if (iVar1 != 0) {
          piVar3 = __errno_location();
          errmsg_ = strerror(*piVar3);
          pcVar4 = 
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
          ;
          fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                  ,0x189);
          fflush(_stderr);
          zmq_abort(errmsg_);
        }
        msg_t::set_flags(&id,'@');
        sVar2 = pipe_t::write(this->_zap_pipe,(int)&id,__buf,(size_t)pcVar4);
        if ((char)sVar2 == '\0') {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ok",
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
                  ,0x18c);
          fflush(_stderr);
          zmq_abort("ok");
        }
        pipe_t::flush(this->_zap_pipe);
      }
      iVar1 = 0;
    }
    options_t::~options_t(&peer.options);
  }
  return iVar1;
}

Assistant:

int zmq::session_base_t::zap_connect ()
{
    if (_zap_pipe != NULL)
        return 0;

    endpoint_t peer = find_endpoint ("inproc://zeromq.zap.01");
    if (peer.socket == NULL) {
        errno = ECONNREFUSED;
        return -1;
    }
    zmq_assert (peer.options.type == ZMQ_REP || peer.options.type == ZMQ_ROUTER
                || peer.options.type == ZMQ_SERVER);

    //  Create a bi-directional pipe that will connect
    //  session with zap socket.
    object_t *parents[2] = {this, peer.socket};
    pipe_t *new_pipes[2] = {NULL, NULL};
    int hwms[2] = {0, 0};
    bool conflates[2] = {false, false};
    int rc = pipepair (parents, new_pipes, hwms, conflates);
    errno_assert (rc == 0);

    //  Attach local end of the pipe to this socket object.
    _zap_pipe = new_pipes[0];
    _zap_pipe->set_nodelay ();
    _zap_pipe->set_event_sink (this);

    send_bind (peer.socket, new_pipes[1], false);

    //  Send empty routing id if required by the peer.
    if (peer.options.recv_routing_id) {
        msg_t id;
        rc = id.init ();
        errno_assert (rc == 0);
        id.set_flags (msg_t::routing_id);
        bool ok = _zap_pipe->write (&id);
        zmq_assert (ok);
        _zap_pipe->flush ();
    }

    return 0;
}